

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

void __thiscall capnp::LocalClient::startResolveTask(LocalClient *this,Server *serverRef)

{
  NullableValue<kj::Promise<capnp::Capability::Client>_> local_40;
  NullableValue<kj::ForkedPromise<void>_> local_30;
  anon_class_8_1_8991fb9c local_18;
  
  (*serverRef->_vptr_Server[2])(&local_40);
  local_18.this = this;
  kj::Maybe<kj::Promise<capnp::Capability::Client>_>::
  map<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_c__:743:47)>
            ((Maybe<kj::ForkedPromise<void>_> *)&local_30,
             (Maybe<kj::Promise<capnp::Capability::Client>_> *)&local_40,&local_18);
  kj::Maybe<kj::ForkedPromise<void>_>::operator=
            (&this->resolveTask,(Maybe<kj::ForkedPromise<void>_> *)&local_30);
  kj::_::NullableValue<kj::ForkedPromise<void>_>::~NullableValue(&local_30);
  kj::_::NullableValue<kj::Promise<capnp::Capability::Client>_>::~NullableValue(&local_40);
  return;
}

Assistant:

void startResolveTask(Capability::Server& serverRef) {
    resolveTask = serverRef.shortenPath().map([this](kj::Promise<Capability::Client> promise) {
      KJ_IF_SOME(r, revoker) {
        promise = r.wrap(kj::mv(promise));
      }

      return promise.then([this](Capability::Client&& cap) {
        auto hook = ClientHook::from(kj::mv(cap));

        if (blocked) {
          // This is a streaming interface and we have some calls queued up as a result. We cannot
          // resolve directly to the new shorter path because this may allow new calls to hop
          // the queue -- we need to embargo new calls until the queue clears out.
          auto promise = kj::newAdaptedPromise<kj::Promise<void>, BlockedCall>(*this)
              .then([hook = kj::mv(hook)]() mutable { return kj::mv(hook); });
          hook = newLocalPromiseClient(kj::mv(promise));
        }

        resolved = kj::mv(hook);
      }).fork();
    });
  }